

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall
QTableViewPrivate::sectionSpanEndLogical
          (QTableViewPrivate *this,QHeaderView *header,int logical,int span)

{
  int visualIndex;
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int unaff_retaddr;
  int i;
  int visual;
  int iVar3;
  
  visualIndex = QHeaderView::visualIndex(_i,unaff_retaddr);
  iVar3 = 1;
  while( true ) {
    if (in_ECX <= iVar3) {
      return in_EDX;
    }
    iVar1 = visualIndex + 1;
    visualIndex = iVar1;
    iVar2 = QHeaderView::count((QHeaderView *)CONCAT44(iVar1,iVar3));
    if (iVar2 <= iVar1) break;
    in_EDX = QHeaderView::logicalIndex((QHeaderView *)CONCAT44(in_EDX,in_ECX),visualIndex);
    iVar3 = iVar3 + 1;
  }
  return in_EDX;
}

Assistant:

int QTableViewPrivate::sectionSpanEndLogical(const QHeaderView *header, int logical, int span) const
{
    int visual = header->visualIndex(logical);
    for (int i = 1; i < span; ) {
        if (++visual >= header->count())
            break;
        logical = header->logicalIndex(visual);
        ++i;
    }
    return logical;
}